

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrdrivr.c
# Opt level: O1

FT_Error pfr_get_metrics(FT_Face pfrface,FT_UInt *anoutline_resolution,FT_UInt *ametrics_resolution,
                        FT_Fixed *ametrics_x_scale,FT_Fixed *ametrics_y_scale)

{
  FT_Size pFVar1;
  FT_Long FVar2;
  FT_Long FVar3;
  
  pFVar1 = pfrface->size;
  if (anoutline_resolution != (FT_UInt *)0x0) {
    *anoutline_resolution = *(FT_UInt *)&pfrface[1].driver;
  }
  if (ametrics_resolution != (FT_UInt *)0x0) {
    *ametrics_resolution = *(FT_UInt *)((long)&pfrface[1].driver + 4);
  }
  if (pFVar1 == (FT_Size)0x0) {
    FVar3 = 0x10000;
    FVar2 = 0x10000;
  }
  else {
    FVar2 = FT_DivFix((ulong)(pFVar1->metrics).x_ppem << 6,
                      (ulong)*(uint *)((long)&pfrface[1].driver + 4));
    FVar3 = FT_DivFix((ulong)(pFVar1->metrics).y_ppem << 6,
                      (ulong)*(uint *)((long)&pfrface[1].driver + 4));
  }
  if (ametrics_x_scale != (FT_Fixed *)0x0) {
    *ametrics_x_scale = FVar2;
  }
  if (ametrics_y_scale != (FT_Fixed *)0x0) {
    *ametrics_y_scale = FVar3;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_get_metrics( FT_Face    pfrface,      /* PFR_Face */
                   FT_UInt   *anoutline_resolution,
                   FT_UInt   *ametrics_resolution,
                   FT_Fixed  *ametrics_x_scale,
                   FT_Fixed  *ametrics_y_scale )
  {
    PFR_Face     face = (PFR_Face)pfrface;
    PFR_PhyFont  phys = &face->phy_font;
    FT_Fixed     x_scale, y_scale;
    FT_Size      size = face->root.size;


    if ( anoutline_resolution )
      *anoutline_resolution = phys->outline_resolution;

    if ( ametrics_resolution )
      *ametrics_resolution = phys->metrics_resolution;

    x_scale = 0x10000L;
    y_scale = 0x10000L;

    if ( size )
    {
      x_scale = FT_DivFix( size->metrics.x_ppem << 6,
                           (FT_Long)phys->metrics_resolution );

      y_scale = FT_DivFix( size->metrics.y_ppem << 6,
                           (FT_Long)phys->metrics_resolution );
    }

    if ( ametrics_x_scale )
      *ametrics_x_scale = x_scale;

    if ( ametrics_y_scale )
      *ametrics_y_scale = y_scale;

    return FT_Err_Ok;
  }